

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.hpp
# Opt level: O0

double __thiscall
Curve<3,_2>::findClosestParameter
          (Curve<3,_2> *this,PointType *point,double init_param,int *max_iter)

{
  ReturnType RVar1;
  ReturnType RVar2;
  ReturnType RVar3;
  double dVar4;
  undefined4 local_ac;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_a8 [8];
  PointType second_order;
  undefined4 local_8c;
  MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> local_88 [8];
  PointType first_order;
  undefined4 local_6c;
  MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> local_68 [16];
  undefined1 local_58 [8];
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
  d;
  int iter;
  double denominator;
  double numerator;
  int *max_iter_local;
  double init_param_local;
  PointType *point_local;
  Curve<3,_2> *this_local;
  
  max_iter_local = (int *)init_param;
  init_param_local = (double)point;
  point_local = (PointType *)this;
  if (0 < *max_iter) {
    for (d._20_4_ = 0; (int)d._20_4_ < *max_iter; d._20_4_ = d._20_4_ + 1) {
      local_6c = 0;
      (*this->_vptr_Curve[2])(local_68,this,&max_iter_local,&local_6c);
      Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::operator-
                ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
                  *)local_58,local_68,
                 (MatrixBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)init_param_local);
      local_8c = 1;
      (*this->_vptr_Curve[2])(local_88,this,&max_iter_local,&local_8c);
      local_ac = 2;
      (*this->_vptr_Curve[2])(local_a8,this,&max_iter_local,&local_ac);
      RVar1 = Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Matrix<double,2,1,0,2,1>const>>
              ::dot<Eigen::Matrix<double,2,1,0,2,1>>
                        ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Matrix<double,2,1,0,2,1>const>>
                          *)local_58,local_88);
      RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,2,1,0,2,1>>::
              dot<Eigen::Matrix<double,2,1,0,2,1>>
                        ((MatrixBase<Eigen::Matrix<double,2,1,0,2,1>> *)local_88,local_88);
      RVar3 = Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Matrix<double,2,1,0,2,1>const>>
              ::dot<Eigen::Matrix<double,2,1,0,2,1>>
                        ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,2,1,0,2,1>const,Eigen::Matrix<double,2,1,0,2,1>const>>
                          *)local_58,local_a8);
      dVar4 = std::numeric_limits<double>::min();
      max_iter_local = (int *)((double)max_iter_local - RVar1 / (RVar2 + RVar3 + dVar4));
    }
    return (double)max_iter_local;
  }
  __assert_fail("max_iter > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tanzby[P]ParametricCurve/src/curve.hpp"
                ,0x43,
                "virtual double Curve<>::findClosestParameter(const PointType &, double, const int &) const [N = 3, PointDim = 2]"
               );
}

Assistant:

virtual auto findClosestParameter(const PointType& point,
                                    double init_param,
                                    const int& max_iter = 20) const -> double {
    /**
     * 找到参数u使得离点p是最近的，即求解
     * f = (C(u)-p)*C'(u) = 0
     * f'= C'(u)*C'(u) + (C(u)-p)*C''(u)
     * 当给定u_{n+1} = u_{n} - f/f'
     */
    assert(max_iter > 0);
    double numerator;
    double denominator;
    for (int iter = 0; iter < max_iter; ++iter) {
      auto d = this->at(init_param) - point;
      auto first_order = this->at(init_param, 1);
      auto second_order = this->at(init_param, 2);

      numerator = d.dot(first_order);
      denominator =
          first_order.dot(first_order) + d.dot(second_order) + std::numeric_limits<double>::min();
      init_param = init_param - numerator / denominator;
    }

    return init_param;
  }